

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O3

bool __thiscall Refal2::CLeftPartCompiler::tryMatchRightVariable(CLeftPartCompiler *this)

{
  CVariables *this_00;
  uint variableIndex;
  TVariableType TVar1;
  CNodeType *pCVar2;
  CVariable *pCVar3;
  bool bVar4;
  bool bVar5;
  TTableIndex TVar6;
  
  pCVar2 = (this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last;
  if (((pCVar2->super_CUnit).type & UT_Variable) == 0) {
    __assert_fail("hole->GetLast()->IsVariable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                  ,0x135,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
  }
  variableIndex = (pCVar2->super_CUnit).field_1.variable;
  this_00 = &(this->super_CFunctionCompilerBase).variables;
  bVar4 = CVariables::IsSet(this_00,variableIndex);
  bVar5 = (this->super_CFunctionCompilerBase).variables.variablesSize <= (int)variableIndex;
  if (bVar4) {
    if (bVar5 || (int)variableIndex < 0) {
LAB_00120b05:
      __assert_fail("IsValidVariableIndex( variableIndex )",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Variables.h"
                    ,0x75,"CVariable &Refal2::CVariables::GetVariable(TVariableIndex)");
    }
    TVar1 = this_00->variables[variableIndex].type;
    if (TVar1 - VT_W < 2) {
      TVar6 = CVariables::GetMainValue(this_00,variableIndex);
      bVar5 = setVariable(this,variableIndex);
      COperationsBuilder::AddMatchRightDuplicate_WV((COperationsBuilder *)this,TVar6,bVar5);
    }
    else if (TVar1 == VT_E) {
      TVar6 = CVariables::GetMainValue(this_00,variableIndex);
      bVar5 = setVariable(this,variableIndex);
      COperationsBuilder::AddMatchRightDuplicate_E((COperationsBuilder *)this,TVar6,bVar5);
    }
    else {
      if (TVar1 != VT_S) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                      ,0x149,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
      }
      TVar6 = CVariables::GetMainValue(this_00,variableIndex);
      bVar5 = setVariable(this,variableIndex);
      COperationsBuilder::AddMatchRightDuplicate_S((COperationsBuilder *)this,TVar6,bVar5);
    }
  }
  else {
    if (bVar5 || (int)variableIndex < 0) goto LAB_00120b05;
    pCVar3 = this_00->variables;
    TVar1 = pCVar3[variableIndex].type;
    if (TVar1 - VT_V < 2) {
      return false;
    }
    if (TVar1 == VT_W) {
      bVar5 = setVariable(this,variableIndex);
      COperationsBuilder::AddMatchRight_W
                ((COperationsBuilder *)this,&pCVar3[variableIndex].qualifier,bVar5);
    }
    else {
      if (TVar1 != VT_S) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                      ,0x15b,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
      }
      bVar5 = setVariable(this,variableIndex);
      COperationsBuilder::AddMatchRight_S
                ((COperationsBuilder *)this,&pCVar3[variableIndex].qualifier,bVar5);
    }
  }
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  return true;
}

Assistant:

bool CLeftPartCompiler::tryMatchRightVariable()
{
	assert( hole->GetLast()->IsVariable() );
	const TVariableIndex variable = hole->GetLast()->Variable();
	if( variables.IsSet( variable ) ) {
		// match duplicate
		switch( variables.GetVariable( variable ).GetType() ) {
			case VT_S:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_S );
				break;
			case VT_W:
			case VT_V:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_WV );
				break;
			case VT_E:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_E );
				break;
			case VT_None:
			default:
				assert( false );
				break;
		}
	} else {
		switch( variables.GetVariable( variable ).GetType() ) {
			case VT_S:
				matchVariable( variable,
					&COperationsBuilder::AddMatchRight_S );
				break;
			case VT_W:
				matchVariable( variable,
					&COperationsBuilder::AddMatchRight_W );
				break;
			case VT_V:
			case VT_E:
				return false;
			case VT_None:
			default:
				assert( false );
				break;
		}
	}
	hole->RemoveLast();
	return true;
}